

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetrepaintmanager.cpp
# Opt level: O1

void __thiscall
QWidgetRepaintManager::addDirtyWidget(QWidgetRepaintManager *this,QWidget *widget,QRegion *rgn)

{
  long lVar1;
  QRegionData *pQVar2;
  bool bVar3;
  QWidgetPrivate *widgetPrivate;
  long in_FS_OFFSET;
  QRegion local_70;
  double local_68;
  double local_60;
  double local_58;
  QRect local_50 [2];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (((widget != (QWidget *)0x0) &&
      (lVar1 = *(long *)&widget->field_0x8, (*(byte *)(lVar1 + 0x252) & 8) == 0)) &&
     ((widget->data->field_0x12 & 4) == 0)) {
    if (*(long *)(lVar1 + 200) == 0) {
      QRegion::operator=((QRegion *)(lVar1 + 0xe0),rgn);
    }
    else {
      local_50[0] = (QRect)QRegion::boundingRect();
      if (*(QGraphicsEffect **)(lVar1 + 200) != (QGraphicsEffect *)0x0) {
        bVar3 = QGraphicsEffect::isEnabled(*(QGraphicsEffect **)(lVar1 + 200));
        if (bVar3) {
          local_70.d = (QRegionData *)(double)local_50[0].x1.m_i.m_i;
          local_68 = (double)local_50[0].y1.m_i.m_i;
          local_60 = (double)(((long)local_50[0].x2.m_i.m_i - (long)local_50[0].x1.m_i.m_i) + 1);
          local_58 = (double)(((local_50[0]._8_8_ >> 0x20) - (local_50[0]._0_8_ >> 0x20)) + 1);
          (**(code **)(**(long **)(lVar1 + 200) + 0x60))(local_50);
          local_50[0] = (QRect)QRectF::toAlignedRect();
        }
      }
      QRegion::QRegion(&local_70,local_50,Rectangle);
      pQVar2 = *(QRegionData **)(lVar1 + 0xe0);
      *(QRegionData **)(lVar1 + 0xe0) = local_70.d;
      local_70.d = pQVar2;
      QRegion::~QRegion(&local_70);
    }
    local_50[0]._0_8_ = widget;
    QtPrivate::QPodArrayOps<QWidget*>::emplace<QWidget*&>
              ((QPodArrayOps<QWidget*> *)(this + 0x18),*(qsizetype *)(this + 0x28),
               (QWidget **)local_50);
    QList<QWidget_*>::end((QList<QWidget_*> *)(this + 0x18));
    *(byte *)(lVar1 + 0x252) = *(byte *)(lVar1 + 0x252) | 8;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetRepaintManager::addDirtyWidget(QWidget *widget, const QRegion &rgn)
{
    if (widget && !widget->d_func()->inDirtyList && !widget->data->in_destructor) {
        QWidgetPrivate *widgetPrivate = widget->d_func();
#if QT_CONFIG(graphicseffect)
        if (widgetPrivate->graphicsEffect)
            widgetPrivate->dirty = widgetPrivate->effectiveRectFor(rgn.boundingRect());
        else
#endif // QT_CONFIG(graphicseffect)
            widgetPrivate->dirty = rgn;
        dirtyWidgets.append(widget);
        widgetPrivate->inDirtyList = true;
    }
}